

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::FlipBoard(BoardView *this,int mode)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  unsigned_short *__src;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiIO *__src_00;
  void *__dest;
  uint uVar8;
  uint uVar9;
  ImGuiIO io;
  float local_3948;
  float fStack_3944;
  undefined1 local_3928 [293];
  byte local_3803;
  long local_d88;
  void *pvStack_d80;
  undefined1 auStack_d78 [3400];
  
  IVar5 = ImGui::GetMousePos();
  fVar1 = (this->m_board_surface).x;
  fVar2 = (this->m_board_surface).y;
  IVar6 = ScreenToCoord(this,IVar5.x,IVar5.y,1.0);
  __src_00 = ImGui::GetIO();
  memcpy(local_3928,__src_00,0x2b9e);
  local_d88 = 0;
  pvStack_d80 = (void *)0x0;
  uVar9 = (__src_00->InputQueueCharacters).Size;
  if (0 < (long)(int)uVar9) {
    uVar8 = 8;
    if (8 < (int)uVar9) {
      uVar8 = uVar9;
    }
    __dest = ImGui::MemAlloc((ulong)(uVar8 * 2));
    if (pvStack_d80 != (void *)0x0) {
      memcpy(__dest,pvStack_d80,(long)(int)local_d88 * 2);
      ImGui::MemFree(pvStack_d80);
    }
    local_d88 = (ulong)uVar8 << 0x20;
    pvStack_d80 = __dest;
  }
  local_d88 = CONCAT44(local_d88._4_4_,uVar9);
  __src = (__src_00->InputQueueCharacters).Data;
  if (__src != (unsigned_short *)0x0) {
    memcpy(pvStack_d80,__src,(long)(int)uVar9 * 2);
  }
  memcpy(auStack_d78,__src_00->KeyMap,0xd44);
  uVar9 = (this->config).flipMode;
  *(byte *)&this->m_current_side = (byte)this->m_current_side ^ 1;
  this->m_dx = -this->m_dx;
  if (this->m_flipVertically == true) {
    if (mode == 1) {
      uVar9 = 0;
    }
    Rotate(this,2);
    if (uVar9 != local_3803) {
      IVar7 = ScreenToCoord(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,1.0
                           );
      local_3948 = IVar6.x;
      fStack_3944 = IVar6.y;
      uVar3 = this->m_dx;
      uVar4 = this->m_dy;
      this->m_dx = (float)uVar3 + (IVar7.x - local_3948);
      this->m_dy = (float)uVar4 + (IVar7.y - fStack_3944);
      Pan(this,4,(int)(fVar1 * 0.5 - IVar5.x));
      Pan(this,2,(int)(fVar2 * 0.5 - IVar5.y));
    }
  }
  this->m_needsRedraw = true;
  if (pvStack_d80 != (void *)0x0) {
    ImGui::MemFree(pvStack_d80);
  }
  return;
}

Assistant:

void BoardView::FlipBoard(int mode) {
	ImVec2 mpos = ImGui::GetMousePos();
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 bpos = ScreenToCoord(mpos.x, mpos.y);
	auto io     = ImGui::GetIO();

	if (mode == 1)
		mode = 0;
	else
		mode = config.flipMode;

	m_current_side ^= 1;
	m_dx = -m_dx;
	if (m_flipVertically) {
		Rotate(2);
		if (io.KeyShift ^ mode) {
			SetTarget(bpos.x, bpos.y);
			Pan(DIR_RIGHT, view.x / 2 - mpos.x);
			Pan(DIR_DOWN, view.y / 2 - mpos.y);
		}
	}
	m_needsRedraw = true;
}